

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadEdgeList(OgreBinarySerializer *this,Mesh *param_1)

{
  StreamReader<false,_false> *this_00;
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  runtime_error *this_01;
  MemoryStreamReader *this_02;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_02 = this->m_reader;
  while( true ) {
    if (*(int *)&this_02->end == *(int *)&this_02->current) {
      return;
    }
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_02);
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar3;
    this_00 = this->m_reader;
    bVar7 = *(int *)&this_00->end == *(int *)&this_00->current;
    if ((bVar7) || (uVar2 != 0xb100)) break;
    StreamReader<false,_false>::IncPtr(this_00,2);
    uVar1 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
    if (uVar1 == '\0') {
      StreamReader<false,_false>::IncPtr(this->m_reader,1);
      uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      StreamReader<false,_false>::IncPtr(this->m_reader,(ulong)uVar3 * 0x30);
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
          uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar3;
          if (uVar2 != 0xb110) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_48[0] = local_38;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_48,"M_EDGE_GROUP not found in M_EDGE_LIST_LOD","");
            std::runtime_error::runtime_error(this_01,(string *)local_48);
            *(undefined ***)this_01 = &PTR__runtime_error_007da4b8;
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          StreamReader<false,_false>::IncPtr(this->m_reader,0xc);
          uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          if (uVar3 != 0) {
            uVar5 = (ulong)uVar3;
            do {
              StreamReader<false,_false>::IncPtr(this->m_reader,0x19);
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar4);
      }
    }
    this_02 = this->m_reader;
  }
  if (bVar7) {
    return;
  }
  StreamReader<false,_false>::IncPtr(this_00,-6);
  return;
}

Assistant:

void OgreBinarySerializer::ReadEdgeList(Mesh * /*mesh*/)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_EDGE_LIST_LOD)
        {
            m_reader->IncPtr(sizeof(uint16_t)); // lod index
            bool manual = Read<bool>();

            if (!manual)
            {
                m_reader->IncPtr(sizeof(uint8_t));
                uint32_t numTriangles = Read<uint32_t>();
                uint32_t numEdgeGroups = Read<uint32_t>();

                size_t skipBytes = (sizeof(uint32_t) * 8 + sizeof(float) * 4) * numTriangles;
                m_reader->IncPtr(skipBytes);

                for (size_t i=0; i<numEdgeGroups; ++i)
                {
                    uint16_t id = ReadHeader();
                    if (id != M_EDGE_GROUP)
                        throw DeadlyImportError("M_EDGE_GROUP not found in M_EDGE_LIST_LOD");

                    m_reader->IncPtr(sizeof(uint32_t) * 3);
                    uint32_t numEdges = Read<uint32_t>();
                    for (size_t j=0; j<numEdges; ++j)
                    {
                        m_reader->IncPtr(sizeof(uint32_t) * 6 + sizeof(uint8_t));
                    }
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}